

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QSharedPointer<QRelation>_>::clear(QList<QSharedPointer<QRelation>_> *this)

{
  long lVar1;
  Data *pDVar2;
  QSharedPointer<QRelation> *pQVar3;
  longlong lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QSharedPointer<QRelation>_> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->d).size;
  if (lVar1 != 0) {
    pDVar2 = (this->d).d;
    if (pDVar2 == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
        pQVar3 = (this->d).ptr;
        lVar5 = 0;
        do {
          QSharedPointer<QRelation>::deref(*(Data **)((long)&pQVar3->d + lVar5));
          lVar5 = lVar5 + 0x10;
        } while (lVar1 << 4 != lVar5);
        (this->d).size = 0;
        goto LAB_001355ea;
      }
      lVar4 = (pDVar2->super_QArrayData).alloc;
    }
    local_48.size = -0x5555555555555556;
    local_48.ptr = (QSharedPointer<QRelation> *)0xaaaaaaaaaaaaaaaa;
    local_30 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
    pQVar3 = (QSharedPointer<QRelation> *)QArrayData::allocate(&local_30,0x10,0x10,lVar4,KeepSize);
    local_48.d = (this->d).d;
    (this->d).d = (Data *)local_30;
    local_48.ptr = (this->d).ptr;
    (this->d).ptr = pQVar3;
    local_48.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<QSharedPointer<QRelation>_>::~QArrayDataPointer(&local_48);
  }
LAB_001355ea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }